

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O1

void __thiscall
OpenMD::SimpleTypeData<OpenMD::EAMParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::EAMParameters> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_002afcb8;
  pcVar1 = (this->data_).latticeType._M_dataplus._M_p;
  paVar2 = &(this->data_).latticeType.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__GenericData_002ac908;
  pcVar1 = (this->super_GenericData).id_._M_dataplus._M_p;
  paVar2 = &(this->super_GenericData).id_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}